

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::CullDistance::NegativeTest::iterate(NegativeTest *this)

{
  bool use_dynamic_index_based_writes;
  GLint GVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  ostream *poVar7;
  ulong uVar8;
  GLchar *pGVar9;
  MessageBuilder *pMVar10;
  TestError *pTVar11;
  NotSupportedError *this_00;
  long lVar12;
  char *pcVar13;
  GLint link_status;
  long local_410;
  GLchar **local_408;
  GLint buffer_size_1;
  GLint compile_status_internal;
  GLint compile_status;
  GLint gl_max_cull_distances_value;
  GLint gl_max_combined_clip_and_cull_distances_value;
  GLint gl_max_clip_distances_value;
  string local_3e8;
  char *vs_body_raw_ptr;
  GLchar *fs_body;
  string vs_body_string;
  string n_gl_culldistance_array_items_string;
  string n_gl_clipdistance_array_items_string;
  string static_write_shader_body_part;
  undefined1 local_338 [8];
  ostream local_330;
  stringstream temp_sstream;
  ostringstream local_1b0 [8];
  ostream local_1a8;
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  fs_body = "#version 130\n\nvoid main()\n{\n}\n";
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_cull_distance");
  if (!bVar2) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&temp_sstream,"GL_ARB_cull_distance is not supported",
                 (allocator<char> *)local_338);
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&temp_sstream);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  gl_max_clip_distances_value = 0;
  gl_max_combined_clip_and_cull_distances_value = 0;
  gl_max_cull_distances_value = 0;
  n_gl_clipdistance_array_items_string._M_dataplus._M_p =
       (pointer)&n_gl_clipdistance_array_items_string.field_2;
  n_gl_clipdistance_array_items_string._M_string_length = 0;
  n_gl_culldistance_array_items_string._M_dataplus._M_p =
       (pointer)&n_gl_culldistance_array_items_string.field_2;
  n_gl_culldistance_array_items_string._M_string_length = 0;
  n_gl_clipdistance_array_items_string.field_2._M_local_buf[0] = '\0';
  n_gl_culldistance_array_items_string.field_2._M_local_buf[0] = '\0';
  static_write_shader_body_part._M_dataplus._M_p = (pointer)&static_write_shader_body_part.field_2;
  static_write_shader_body_part._M_string_length = 0;
  static_write_shader_body_part.field_2._M_local_buf[0] = '\0';
  (**(code **)(lVar6 + 0x868))(0xd32);
  (**(code **)(lVar6 + 0x868))(0x82fa,&gl_max_combined_clip_and_cull_distances_value);
  (**(code **)(lVar6 + 0x868))(0x82f9,&gl_max_cull_distances_value);
  if (gl_max_cull_distances_value + gl_max_clip_distances_value <
      gl_max_combined_clip_and_cull_distances_value) {
    _temp_sstream = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
    ;
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::operator<<((ostream *)local_1b0,
                    "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES is larger than or equal to the sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CULL_DISTANCES. Skipping."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&temp_sstream,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&temp_sstream);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)&n_gl_clipdistance_array_items_string,(string *)local_338);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp_sstream);
    std::__cxx11::stringstream::stringstream((stringstream *)&temp_sstream);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)&n_gl_culldistance_array_items_string,(string *)local_338);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp_sstream);
    std::__cxx11::stringstream::stringstream((stringstream *)&temp_sstream);
    poVar7 = std::operator<<(&local_1a8,"gl_ClipDistance[");
    poVar7 = std::operator<<(poVar7,n_gl_clipdistance_array_items_string._M_dataplus._M_p);
    poVar7 = std::operator<<(poVar7,"] = 0.0f;\n");
    poVar7 = std::operator<<(poVar7,"gl_CullDistance[");
    poVar7 = std::operator<<(poVar7,n_gl_culldistance_array_items_string._M_dataplus._M_p);
    std::operator<<(poVar7,"] = 0.0f;\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&static_write_shader_body_part,(string *)local_338);
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp_sstream);
    compile_status = 0;
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar4;
    GVar4 = (**(code **)(lVar6 + 0x3c8))();
    this->m_po_id = GVar4;
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar4;
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glCreateProgram() / glCreateShader() calls failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc0c);
    (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glAttachShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc11);
    (**(code **)(lVar6 + 0x12b8))(this->m_fs_id,1,&fs_body,0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc15);
    (**(code **)(lVar6 + 0x248))(this->m_fs_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc18);
    (**(code **)(lVar6 + 0xa70))(this->m_fs_id,0x8b81,&compile_status);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc1b);
    if (compile_status == 0) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,"Fragment shader failed to compile.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                 ,0xc1f);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_408 = &this->m_temp_buffer;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      local_410 = lVar12;
      std::__cxx11::stringstream::stringstream((stringstream *)&temp_sstream);
      vs_body_string._M_dataplus._M_p = (pointer)&vs_body_string.field_2;
      vs_body_string._M_string_length = 0;
      vs_body_string.field_2._M_local_buf[0] = '\0';
      poVar7 = std::operator<<(&local_1a8,
                               "#version 130\n\n    #extension GL_ARB_cull_distance : require\n\n");
      std::operator<<(poVar7,"\n");
      bVar2 = (bool)(&DAT_01642bfc)[local_410 * 2];
      if (bVar2 == true) {
        poVar7 = std::operator<<(&local_1a8,"#define ");
        poVar7 = std::operator<<(poVar7,"REDECLARE_OUTPUT_VARIABLES");
        std::operator<<(poVar7,"\n");
      }
      use_dynamic_index_based_writes = (bool)(&DAT_01642bfd)[local_410 * 2];
      if (use_dynamic_index_based_writes == true) {
        poVar7 = std::operator<<(&local_1a8,"#define ");
        poVar7 = std::operator<<(poVar7,"DYNAMIC_INDEX_BASED_WRITES");
        std::operator<<(poVar7,"\n");
      }
      std::operator<<(&local_1a8,
                      "#ifdef REDECLARE_OUTPUT_VARIABLES\n    out float gl_ClipDistance[N_GL_CLIPDISTANCE_ENTRIES];\n    out float gl_CullDistance[N_GL_CULLDISTANCE_ENTRIES];\n#endif\n\nvoid main()\n{\n#ifdef DYNAMIC_INDEX_BASED_WRITES\n    for (int n_clipdistance_entry = 0;\n             n_clipdistance_entry < N_GL_CLIPDISTANCE_ENTRIES;\n           ++n_clipdistance_entry)\n    {\n        gl_ClipDistance[n_clipdistance_entry] = float(n_clipdistance_entry) / float(N_GL_CLIPDISTANCE_ENTRIES);\n    }\n\n    for (int n_culldistance_entry = 0;\n             n_culldistance_entry < N_GL_CULLDISTANCE_ENTRIES;\n           ++n_culldistance_entry)\n    {\n        gl_CullDistance[n_culldistance_entry] = float(n_culldistance_entry) / float(N_GL_CULLDISTANCE_ENTRIES);\n    }\n#else\n    INSERT_STATIC_WRITES\n#endif\n}\n"
                     );
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&vs_body_string,(string *)local_338);
      std::__cxx11::string::~string((string *)local_338);
      while (uVar8 = std::__cxx11::string::find((char *)&vs_body_string,0x1641ef2),
            uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&vs_body_string,uVar8,(string *)0x19);
        std::__cxx11::string::_M_assign((string *)&vs_body_string);
      }
      while (uVar8 = std::__cxx11::string::find((char *)&vs_body_string,0x1641f15),
            uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&vs_body_string,uVar8,(string *)0x19);
        std::__cxx11::string::_M_assign((string *)&vs_body_string);
      }
      while (uVar8 = std::__cxx11::string::find((char *)&vs_body_string,0x1642555),
            uVar8 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)&vs_body_string,uVar8,(string *)0x14);
        std::__cxx11::string::_M_assign((string *)&vs_body_string);
      }
      compile_status_internal = 0;
      vs_body_raw_ptr = vs_body_string._M_dataplus._M_p;
      (**(code **)(lVar6 + 0x12b8))(this->m_vs_id,1,&vs_body_raw_ptr,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glShaderSource() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc64);
      (**(code **)(lVar6 + 0x248))(this->m_vs_id);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc67);
      (**(code **)(lVar6 + 0xa70))(this->m_vs_id,0x8b81,&compile_status_internal);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      pcVar13 = "glGetShaderiv() call failed.";
      glu::checkError(dVar5,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc6a);
      if (compile_status_internal == 0) {
        link_status = 0;
        local_338 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        getTestDescription_abi_cxx11_
                  (&local_3e8,(NegativeTest *)pcVar13,(int)local_410,bVar2,
                   use_dynamic_index_based_writes);
        std::operator<<(&local_330,(string *)&local_3e8);
        std::operator<<(&local_330,
                        "has failed (as expected) to compile with the following info log:\n\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
        (**(code **)(lVar6 + 0xa70))(this->m_vs_id,0x8b84,&link_status);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc78);
        GVar1 = link_status;
        iVar3 = link_status + 1;
        pGVar9 = (GLchar *)operator_new__((long)iVar3);
        this->m_temp_buffer = pGVar9;
        memset(pGVar9,0,(long)iVar3);
        (**(code **)(lVar6 + 0xa58))(this->m_vs_id,GVar1,0,pGVar9);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc80);
        local_338 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,local_408);
        lVar12 = local_410;
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        link_status = 0;
        (**(code **)(lVar6 + 0xce8))(this->m_po_id);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc8f);
        (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        pcVar13 = "glGetProgramiv() call failed.";
        glu::checkError(dVar5,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc92);
        lVar12 = local_410;
        if (link_status == 1) {
          local_338 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
          getTestDescription_abi_cxx11_
                    (&local_3e8,(NegativeTest *)pcVar13,(int)local_410,bVar2,
                     use_dynamic_index_based_writes);
          std::operator<<(&local_330,(string *)&local_3e8);
          std::operator<<(&local_330,"has linked successfully which is invalid!");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,
                     "Program object has linked successfully, even though the process should have failed."
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                     ,0xc9b);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        buffer_size_1 = 0;
        local_338 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        getTestDescription_abi_cxx11_
                  (&local_3e8,(NegativeTest *)pcVar13,(int)lVar12,bVar2,
                   use_dynamic_index_based_writes);
        std::operator<<(&local_330,(string *)&local_3e8);
        std::operator<<(&local_330,
                        "has failed (as expected) to link with the following info log:\n\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
        (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b84,&buffer_size_1);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xca8);
        GVar1 = buffer_size_1;
        iVar3 = buffer_size_1 + 1;
        pGVar9 = (GLchar *)operator_new__((long)iVar3);
        this->m_temp_buffer = pGVar9;
        memset(pGVar9,0,(long)iVar3);
        (**(code **)(lVar6 + 0x988))(this->m_po_id,GVar1,0,pGVar9);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glGetProgramInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xcb0);
        local_338 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_338,local_408);
        lVar12 = local_410;
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
      if (*local_408 != (GLchar *)0x0) {
        operator_delete__(*local_408);
      }
      *local_408 = (GLchar *)0x0;
      std::__cxx11::string::~string((string *)&vs_body_string);
      std::__cxx11::stringstream::~stringstream((stringstream *)&temp_sstream);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  std::__cxx11::string::~string((string *)&static_write_shader_body_part);
  std::__cxx11::string::~string((string *)&n_gl_culldistance_array_items_string);
  std::__cxx11::string::~string((string *)&n_gl_clipdistance_array_items_string);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CullDistance::NegativeTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Build the test shaders. */
	const glw::GLchar* token_dynamic_index_based_writes = "DYNAMIC_INDEX_BASED_WRITES";
	const glw::GLchar* token_insert_static_writes		= "INSERT_STATIC_WRITES";
	const glw::GLchar* token_n_gl_clipdistance_entries  = "N_GL_CLIPDISTANCE_ENTRIES";
	const glw::GLchar* token_n_gl_culldistance_entries  = "N_GL_CULLDISTANCE_ENTRIES";
	const glw::GLchar* token_redeclare_output_variables = "REDECLARE_OUTPUT_VARIABLES";

	const glw::GLchar* fs_body = "#version 130\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	const glw::GLchar* vs_body_preamble = "#version 130\n"
										  "\n"
										  "    #extension GL_ARB_cull_distance : require\n"
										  "\n";

	const glw::GLchar* vs_body_main = "#ifdef REDECLARE_OUTPUT_VARIABLES\n"
									  "    out float gl_ClipDistance[N_GL_CLIPDISTANCE_ENTRIES];\n"
									  "    out float gl_CullDistance[N_GL_CULLDISTANCE_ENTRIES];\n"
									  "#endif\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "#ifdef DYNAMIC_INDEX_BASED_WRITES\n"
									  "    for (int n_clipdistance_entry = 0;\n"
									  "             n_clipdistance_entry < N_GL_CLIPDISTANCE_ENTRIES;\n"
									  "           ++n_clipdistance_entry)\n"
									  "    {\n"
									  "        gl_ClipDistance[n_clipdistance_entry] = float(n_clipdistance_entry) / "
									  "float(N_GL_CLIPDISTANCE_ENTRIES);\n"
									  "    }\n"
									  "\n"
									  "    for (int n_culldistance_entry = 0;\n"
									  "             n_culldistance_entry < N_GL_CULLDISTANCE_ENTRIES;\n"
									  "           ++n_culldistance_entry)\n"
									  "    {\n"
									  "        gl_CullDistance[n_culldistance_entry] = float(n_culldistance_entry) / "
									  "float(N_GL_CULLDISTANCE_ENTRIES);\n"
									  "    }\n"
									  "#else\n"
									  "    INSERT_STATIC_WRITES\n"
									  "#endif\n"
									  "}\n";

	/* This test should only be executed if ARB_cull_distance is supported, or if
	 * we're running a GL4.5 context
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_cull_distance") &&
		!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)))
	{
		throw tcu::NotSupportedError("GL_ARB_cull_distance is not supported");
	}

	/* It only makes sense to run this test if GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES
	 * is lower than a sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CLIP_CULL_DISTANCES.
	 */
	glw::GLint  gl_max_clip_distances_value					  = 0;
	glw::GLint  gl_max_combined_clip_and_cull_distances_value = 0;
	glw::GLint  gl_max_cull_distances_value					  = 0;
	glw::GLuint n_gl_clipdistance_array_items				  = 0;
	std::string n_gl_clipdistance_array_items_string;
	glw::GLuint n_gl_culldistance_array_items = 0;
	std::string n_gl_culldistance_array_items_string;
	std::string static_write_shader_body_part;

	gl.getIntegerv(GL_MAX_CLIP_DISTANCES, &gl_max_clip_distances_value);
	gl.getIntegerv(GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES, &gl_max_combined_clip_and_cull_distances_value);
	gl.getIntegerv(GL_MAX_CULL_DISTANCES, &gl_max_cull_distances_value);

	if (gl_max_clip_distances_value + gl_max_cull_distances_value < gl_max_combined_clip_and_cull_distances_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES is larger than or equal to "
							  "the sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CULL_DISTANCES. Skipping."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}

	n_gl_clipdistance_array_items = gl_max_clip_distances_value;
	n_gl_culldistance_array_items = gl_max_combined_clip_and_cull_distances_value - gl_max_clip_distances_value + 1;

	/* Determine the number of items we will want the gl_ClipDistance and gl_CullDistance arrays
	 * to hold for test iterations that will re-declare the built-in output variables.
	 */
	{
		std::stringstream temp_sstream;

		temp_sstream << n_gl_clipdistance_array_items;

		n_gl_clipdistance_array_items_string = temp_sstream.str();
	}

	{
		std::stringstream temp_sstream;

		temp_sstream << n_gl_culldistance_array_items;

		n_gl_culldistance_array_items_string = temp_sstream.str();
	}

	/* Form the "static write" shader body part. */
	{
		std::stringstream temp_sstream;

		temp_sstream << "gl_ClipDistance[" << n_gl_clipdistance_array_items_string.c_str() << "] = 0.0f;\n"
					 << "gl_CullDistance[" << n_gl_culldistance_array_items_string.c_str() << "] = 0.0f;\n";

		static_write_shader_body_part = temp_sstream.str();
	}

	/* Prepare GL objects before we continue */
	glw::GLint compile_status = GL_FALSE;

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() / glCreateShader() calls failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_vs_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.shaderSource(m_fs_id, 1,			/* count */
					&fs_body, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_fs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_fs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Fragment shader failed to compile.");
	}

	/* Run three separate test iterations. */
	struct _test_item
	{
		bool should_redeclare_output_variables;
		bool use_dynamic_index_based_writes;
	} test_items[] = { /* Negative Test 1 */
					   { true, false },

					   /* Negative Test 2 */
					   { false, false },

					   /* Negative Test 3 */
					   { false, true }
	};
	const unsigned int n_test_items = sizeof(test_items) / sizeof(test_items[0]);

	for (unsigned int n_test_item = 0; n_test_item < n_test_items; ++n_test_item)
	{
		const _test_item& current_test_item = test_items[n_test_item];

		/* Prepare vertex shader body */
		std::size_t		  token_position = std::string::npos;
		std::stringstream vs_body_sstream;
		std::string		  vs_body_string;

		vs_body_sstream << vs_body_preamble << "\n";

		if (current_test_item.should_redeclare_output_variables)
		{
			vs_body_sstream << "#define " << token_redeclare_output_variables << "\n";
		}

		if (current_test_item.use_dynamic_index_based_writes)
		{
			vs_body_sstream << "#define " << token_dynamic_index_based_writes << "\n";
		}

		vs_body_sstream << vs_body_main;

		/* Replace tokens with meaningful values */
		vs_body_string = vs_body_sstream.str();

		while ((token_position = vs_body_string.find(token_n_gl_clipdistance_entries)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_n_gl_clipdistance_entries),
													n_gl_clipdistance_array_items_string);
		}

		while ((token_position = vs_body_string.find(token_n_gl_culldistance_entries)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_n_gl_clipdistance_entries),
													n_gl_culldistance_array_items_string);
		}

		while ((token_position = vs_body_string.find(token_insert_static_writes)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_insert_static_writes),
													static_write_shader_body_part);
		}

		/* Try to compile the vertex shader */
		glw::GLint  compile_status_internal = GL_FALSE;
		const char* vs_body_raw_ptr			= vs_body_string.c_str();

		gl.shaderSource(m_vs_id, 1,					/* count */
						&vs_body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		gl.compileShader(m_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status_internal);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status_internal == GL_FALSE)
		{
			glw::GLint buffer_size = 0;

			/* Log the compilation error */
			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has failed (as expected) to compile with the following info log:\n\n"
							   << tcu::TestLog::EndMessage;

			gl.getShaderiv(m_vs_id, GL_INFO_LOG_LENGTH, &buffer_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			m_temp_buffer = new glw::GLchar[buffer_size + 1];

			memset(m_temp_buffer, 0, buffer_size + 1);

			gl.getShaderInfoLog(m_vs_id, buffer_size, DE_NULL, /* length */
								m_temp_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog() call failed.");

			m_testCtx.getLog() << tcu::TestLog::Message << m_temp_buffer << tcu::TestLog::EndMessage;

			delete[] m_temp_buffer;
			m_temp_buffer = DE_NULL;

			/* Move on to the next iteration */
			continue;
		}

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has linked successfully which is invalid!" << tcu::TestLog::EndMessage;

			TCU_FAIL("Program object has linked successfully, even though the process should have failed.");
		}
		else
		{
			glw::GLint buffer_size = 0;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has failed (as expected) to link with the following info log:\n\n"
							   << tcu::TestLog::EndMessage;

			gl.getProgramiv(m_po_id, GL_INFO_LOG_LENGTH, &buffer_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			m_temp_buffer = new glw::GLchar[buffer_size + 1];

			memset(m_temp_buffer, 0, buffer_size + 1);

			gl.getProgramInfoLog(m_po_id, buffer_size, DE_NULL, /* length */
								 m_temp_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog() call failed.");

			m_testCtx.getLog() << tcu::TestLog::Message << m_temp_buffer << tcu::TestLog::EndMessage;

			delete[] m_temp_buffer;
			m_temp_buffer = DE_NULL;
		}
	} /* for (all test items) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}